

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519-donna-helpers.h
# Opt level: O0

void curve25519_recip(uint64_t *out,uint64_t *z)

{
  uint64_t local_a8;
  bignum25519 b;
  uint64_t local_78;
  bignum25519 t0;
  uint64_t local_48;
  bignum25519 a;
  uint64_t *z_local;
  uint64_t *out_local;
  
  curve25519_square_times(&local_48,z,1);
  curve25519_square_times(&local_78,&local_48,2);
  curve25519_mul_noinline(&local_a8,&local_78,z);
  curve25519_mul_noinline(&local_48,&local_a8,&local_48);
  curve25519_square_times(&local_78,&local_48,1);
  curve25519_mul_noinline(&local_a8,&local_78,&local_a8);
  curve25519_pow_two5mtwo0_two250mtwo0(&local_a8);
  curve25519_square_times(&local_a8,&local_a8,5);
  curve25519_mul_noinline(out,&local_a8,&local_48);
  return;
}

Assistant:

static void
curve25519_recip(bignum25519 out, const bignum25519 z) {
	bignum25519 ALIGN(16) a,t0,b;

	/* 2 */ curve25519_square_times(a, z, 1); /* a = 2 */
	/* 8 */ curve25519_square_times(t0, a, 2);
	/* 9 */ curve25519_mul_noinline(b, t0, z); /* b = 9 */
	/* 11 */ curve25519_mul_noinline(a, b, a); /* a = 11 */
	/* 22 */ curve25519_square_times(t0, a, 1);
	/* 2^5 - 2^0 = 31 */ curve25519_mul_noinline(b, t0, b);
	/* 2^250 - 2^0 */ curve25519_pow_two5mtwo0_two250mtwo0(b);
	/* 2^255 - 2^5 */ curve25519_square_times(b, b, 5);
	/* 2^255 - 21 */ curve25519_mul_noinline(out, b, a);
}